

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O3

uint ** gf_matr_mul(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint **ppuVar4;
  uint **ppuVar5;
  undefined4 uVar6;
  uint cols;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000034;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  puVar10 = (undefined4 *)CONCAT44(in_register_00000034,a_rows);
  if (a_cols == b_rows) {
    ppuVar4 = matrix_new(a_rows,b_cols);
    if (a_rows != 0) {
      uVar11 = 0;
      do {
        if (b_cols != 0) {
          puVar1 = ppuVar4[uVar11];
          uVar12 = 0;
          do {
            puVar1[uVar12] = 0;
            if (a_cols != 0) {
              puVar2 = a[uVar11];
              uVar14 = 0;
              uVar7 = 0;
              do {
                uVar13 = 0;
                if ((ulong)puVar2[uVar14] != 0) {
                  uVar13 = 0;
                  if (b[uVar14][uVar12] != 0) {
                    uVar13 = index_of[b[uVar14][uVar12]] + index_of[puVar2[uVar14]];
                    uVar3 = (index_of[b[uVar14][uVar12]] - 0xff) + index_of[puVar2[uVar14]];
                    if (uVar13 < 0xff) {
                      uVar3 = uVar13;
                    }
                    uVar13 = alpha_of[uVar3];
                  }
                }
                uVar7 = uVar7 ^ uVar13;
                puVar1[uVar12] = uVar7;
                uVar14 = uVar14 + 1;
              } while (a_cols != uVar14);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != b_cols);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != a_rows);
    }
    return ppuVar4;
  }
  gf_matr_mul_cold_1();
  if ((uint)puVar10 != b_rows) {
    gf_matr_mul_vector_cold_1();
    uVar7 = (uint)puVar10;
    if (uVar7 == 2 || uVar7 == cols) {
      uVar3 = gf_matr_det(a,uVar7,cols);
      ppuVar4 = matrix_copy(a,uVar7,cols);
      ppuVar5 = matrix_new(uVar7,cols);
      puVar1 = ppuVar4[1];
      uVar13 = **ppuVar4;
      **ppuVar4 = puVar1[1];
      puVar1[1] = uVar13;
      if (uVar7 != 0) {
        uVar11 = 0;
        do {
          if (cols != 0) {
            puVar1 = ppuVar4[uVar11];
            puVar2 = ppuVar5[uVar11];
            uVar12 = 0;
            do {
              uVar14 = (ulong)puVar1[uVar12];
              if (uVar14 != 0 && uVar3 != 0) {
                iVar8 = index_of[uVar14] - index_of[uVar3];
                iVar9 = iVar8 + 0xff;
                if (-1 < iVar8) {
                  iVar9 = iVar8;
                }
                uVar13 = alpha_of[iVar9];
              }
              else {
                uVar13 = -(uint)(uVar14 != 0);
              }
              puVar2[uVar12] = uVar13;
              uVar12 = uVar12 + 1;
            } while (cols != uVar12);
          }
          uVar11 = uVar11 + 1;
          uVar13 = cols;
        } while (uVar11 != ((ulong)puVar10 & 0xffffffff));
      }
      matrix_free(ppuVar4,uVar7,uVar13);
      return ppuVar5;
    }
    gf_matr_inv_cold_1();
    if ((int)a == 2) {
      ppuVar4 = (uint **)calloc(5,4);
      *ppuVar4 = (uint *)0xe700000074;
      ppuVar4[1] = (uint *)0x1e000000d8;
      *(undefined4 *)(ppuVar4 + 2) = 1;
      uVar6 = 5;
    }
    else {
      if ((int)a != 1) {
        return (uint **)0x0;
      }
      ppuVar4 = (uint **)calloc(2,4);
      *ppuVar4 = (uint *)0x100000002;
      uVar6 = 2;
    }
    if (puVar10 != (undefined4 *)0x0) {
      *puVar10 = uVar6;
    }
    return ppuVar4;
  }
  uVar11 = (ulong)puVar10 & 0xffffffff;
  ppuVar4 = (uint **)calloc(uVar11,4);
  if ((uint)puVar10 != 0) {
    uVar12 = 0;
    do {
      uVar14 = 0;
      uVar7 = 0;
      do {
        uVar13 = 0;
        if (((ulong)a[uVar12][uVar14] != 0) && (uVar3 = *(uint *)((long)b + uVar14 * 4), uVar3 != 0)
           ) {
          uVar13 = index_of[uVar3] + index_of[a[uVar12][uVar14]];
          uVar3 = (index_of[uVar3] - 0xff) + index_of[a[uVar12][uVar14]];
          if (uVar13 < 0xff) {
            uVar3 = uVar13;
          }
          uVar13 = alpha_of[uVar3];
        }
        uVar7 = uVar7 ^ uVar13;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      *(uint *)((long)ppuVar4 + uVar12 * 4) = uVar7;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar11);
  }
  return ppuVar4;
}

Assistant:

uint32_t **gf_matr_mul(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
                  uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_cols != b_rows)
        fatal("gf_matr_mul", " a_cols != b_rows\n");

    uint32_t **c = matrix_new(a_rows, b_cols);
    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < b_cols; j++)
        {
            c[i][j] = 0;
            for (uint32_t _k = 0; _k < b_rows; _k++)
                c[i][j] = gf_sum(c[i][j], gf_mul(a[i][_k], b[_k][j]));
        }

    return c;
}